

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<const_libaom_test::AV1CodecFactory_*> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<const_libaom_test::AV1CodecFactory_*> PVar1;
  _Vector_base<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
  _Stack_28;
  
  ValueArray<libaom_test::CodecFactory_const*>::MakeVector<libaom_test::AV1CodecFactory_const*,0ul>
            (&_Stack_28);
  ValuesIn<std::vector<libaom_test::AV1CodecFactory_const*,std::allocator<libaom_test::AV1CodecFactory_const*>>>
            ((testing *)this,
             (vector<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
              *)&_Stack_28);
  std::
  _Vector_base<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
  ::~_Vector_base(&_Stack_28);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<const_libaom_test::AV1CodecFactory_*>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }